

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  ulong uVar1;
  pointer paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bit_pointer puVar5;
  PyTypeObject **ppPVar6;
  handle hVar7;
  argument_record aVar8;
  function_record *pfVar9;
  long lVar10;
  handle hVar11;
  pointer pfVar12;
  pointer pfVar13;
  type_info *ptVar14;
  _Bit_type *p_Var15;
  byte bVar16;
  function_record *pfVar17;
  iterator __begin3;
  ulong uVar18;
  pointer pfVar19;
  _Bit_type *p_Var20;
  long lVar21;
  size_type __new_size;
  char *pcVar22;
  char cVar23;
  pointer paVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  reference rVar31;
  int local_1a0;
  tuple extra_args;
  handle arg;
  handle hStack_180;
  undefined1 auStack_178 [16];
  _Bit_pointer local_168;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  PyObject *local_120;
  dict kwargs;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  handle local_b8;
  string msg;
  undefined1 local_90 [16];
  pointer local_80;
  handle hStack_78;
  _Bit_pointer local_70;
  object local_60;
  PyTypeObject **local_58;
  long local_50;
  ulong local_48;
  handle local_40 [2];
  
  pfVar9 = (function_record *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                  ,0x1a0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar1 = args_in[1].ob_refcnt;
  if (uVar1 == 0) {
    local_b8.m_ptr = (PyObject *)0x0;
  }
  else {
    local_b8.m_ptr = (PyObject *)args_in[1].ob_type;
  }
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pfVar9 == (function_record *)0x0) {
    bVar29 = false;
  }
  else {
    bVar29 = pfVar9->next != (function_record *)0x0;
  }
  local_58 = &args_in[1].ob_type;
  local_120 = (PyObject *)0x1;
  for (pfVar17 = pfVar9; pfVar17 != (function_record *)0x0; pfVar17 = pfVar17->next) {
    bVar16 = (pfVar17->field_0x59 & 8) >> 3;
    lVar21 = (long)((char)(pfVar17->field_0x59 << 3) >> 7);
    uVar25 = ((ulong)pfVar17->nargs - (ulong)bVar16) + lVar21;
    if (((bVar16 != 0) || (uVar1 <= uVar25)) &&
       ((uVar25 <= uVar1 ||
        (uVar25 <= (ulong)((long)(pfVar17->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pfVar17->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
      local_48 = (ulong)pfVar17->nargs;
      detail::function_call::function_call((function_call *)&msg,pfVar17,local_b8);
      local_50 = -(ulong)bVar16;
      uVar18 = uVar25;
      if (uVar1 < uVar25) {
        uVar18 = uVar1;
      }
      lVar26 = 0;
      for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
        paVar2 = (pfVar17->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar27 < (ulong)((long)(pfVar17->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 5))
        {
          paVar24 = paVar2 + lVar26;
          bVar30 = paVar2 != (pointer)0x0;
          if ((((kwargs_in == (PyObject *)0x0) || (paVar2 == (pointer)0x0)) ||
              (bVar30 = true, *(long *)paVar24 == 0)) ||
             (lVar10 = PyDict_GetItemString(kwargs_in), lVar10 == 0)) goto LAB_0011d98f;
LAB_0011db34:
          bVar30 = false;
          goto LAB_0011ded1;
        }
        bVar30 = false;
        paVar24 = (pointer)0x0;
LAB_0011d98f:
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                        ,0x1dd,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        arg.m_ptr = (PyObject *)(&args_in[1].ob_type)[uVar27];
        if (((bVar30) && (((byte)paVar24[0x18] & 2) == 0)) &&
           ((PyTypeObject *)arg.m_ptr == (PyTypeObject *)&_Py_NoneStruct)) goto LAB_0011db34;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                   &msg._M_string_length,&arg);
        aVar8 = (argument_record)0x1;
        if (bVar30) {
          aVar8 = paVar24[0x18];
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_90,(bool)((byte)aVar8 & 1));
        lVar26 = lVar26 + 0x20;
      }
      if (kwargs_in != (PyObject *)0x0) {
        kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      }
      uVar27 = uVar18;
      kwargs.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      if (uVar1 < uVar25) {
        lVar21 = (lVar21 + local_50 + local_48) - uVar18;
        lVar26 = uVar18 << 5;
        bVar30 = false;
        while (bVar28 = lVar21 != 0, lVar21 = lVar21 + -1, uVar27 = uVar25, bVar28) {
          paVar2 = (pfVar17->args).
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          arg.m_ptr = (PyObject *)0x0;
          if (((kwargs_in == (PyObject *)0x0) || (*(long *)(paVar2 + lVar26) == 0)) ||
             (arg.m_ptr = (PyObject *)PyDict_GetItemString(kwargs.super_object.super_handle.m_ptr),
             arg.m_ptr == (PyObject *)0x0)) {
            hVar7.m_ptr = *(PyObject **)(paVar2 + lVar26 + 0x10);
            hVar11.m_ptr = arg.m_ptr;
          }
          else {
            if (!bVar30) {
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)PyDict_Copy(kwargs.super_object.super_handle.m_ptr);
              object::operator=(&kwargs.super_object,(object *)&second_pass_convert);
              object::~object((object *)&second_pass_convert);
            }
            PyDict_DelItemString
                      (kwargs.super_object.super_handle.m_ptr,*(undefined8 *)(paVar2 + lVar26));
            bVar30 = true;
            hVar7 = arg;
            hVar11 = arg;
          }
          arg.m_ptr = hVar7.m_ptr;
          if (arg.m_ptr == (PyObject *)0x0) goto LAB_0011db65;
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,&arg);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_90,
                     (bool)((byte)paVar2[lVar26 + 0x18] & 1));
          lVar26 = lVar26 + 0x20;
        }
      }
      if ((((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) ||
          (lVar21 = PyDict_Size(), lVar21 == 0)) ||
         (hVar11 = arg, (pfVar17->field_0x59 & 0x10) != 0)) {
        tuple::tuple(&extra_args,0);
        bVar16 = pfVar17->field_0x59;
        if ((bVar16 & 8) != 0) {
          if (uVar18 == 0) {
            args_in->ob_refcnt = args_in->ob_refcnt + 1;
            arg.m_ptr = args_in;
LAB_0011dc6c:
            object::operator=(&extra_args.super_object,(object *)&arg);
            object::~object((object *)&arg);
          }
          else {
            pfVar19 = (pointer)(uVar1 - uVar27);
            if (uVar1 < uVar27 || pfVar19 == (pointer)0x0) {
              tuple::tuple((tuple *)&arg,0);
              goto LAB_0011dc6c;
            }
            tuple::tuple((tuple *)&arg,(size_t)pfVar19);
            object::operator=(&extra_args.super_object,(object *)&arg);
            object::~object((object *)&arg);
            ppPVar6 = local_58;
            pfVar12 = (pointer)0x0;
            while (pfVar13 = pfVar12, pfVar19 != pfVar13) {
              if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                              ,0x21e,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)ppPVar6[(long)&pfVar13->func + uVar27];
              if ((PyTypeObject *)
                  second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (PyTypeObject *)0x0) {
                (((PyTypeObject *)
                 second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->ob_base).ob_base.
                ob_refcnt = (((PyTypeObject *)
                             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->
                            ob_base).ob_base.ob_refcnt + 1;
              }
              hStack_180.m_ptr = (PyObject *)extra_args.super_object.super_handle.m_ptr;
              auStack_178._8_8_ = (PyObject *)0x0;
              detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&arg,
                         (_object **)&second_pass_convert);
              object::~object((object *)(auStack_178 + 8));
              auStack_178._0_8_ = pfVar13;
              pfVar12 = (pointer)((long)&pfVar13->func + 1);
            }
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,(value_type *)&extra_args);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_90,false);
          bVar16 = pfVar17->field_0x59;
        }
        if ((bVar16 & 0x10) != 0) {
          if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
            dict::dict((dict *)&arg);
            object::operator=(&kwargs.super_object,(object *)&arg);
            object::~object((object *)&arg);
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,(value_type *)&kwargs);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_90,false);
        }
        __new_size = (long)(msg.field_2._M_allocated_capacity - msg._M_string_length) >> 3;
        if ((__new_size != pfVar17->nargs) ||
           (((ulong)hStack_78.m_ptr & 0xffffffff) + ((long)local_80 - local_90._0_8_) * 8 !=
            __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        if (bVar29) {
          std::vector<bool,_std::allocator<bool>_>::resize(&second_pass_convert,__new_size,false);
          puVar5 = local_70;
          hVar11.m_ptr = hStack_78.m_ptr;
          pfVar19 = local_80;
          uVar4 = local_90._8_8_;
          uVar3 = local_90._0_8_;
          local_168 = local_70;
          auStack_178._0_8_ = local_80;
          auStack_178._8_8_ = hStack_78.m_ptr;
          arg.m_ptr = (PyObject *)local_90._0_8_;
          hStack_180.m_ptr = (PyObject *)local_90._8_8_;
          local_70 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_80 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_78.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_90._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_90._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar19;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar11.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar4;
        }
        local_120 = (PyObject *)(*pfVar17->impl)((function_call *)&msg);
        bVar30 = local_120 != (PyObject *)0x1;
        if ((bool)(bVar29 & local_120 == (PyObject *)0x1)) {
          uVar18 = (ulong)((byte)pfVar17->field_0x59 >> 5 & 1);
          do {
            bVar30 = false;
            if (uVar25 <= uVar18) goto LAB_0011deab;
            rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&second_pass_convert,uVar18);
            puVar5 = local_70;
            hVar11.m_ptr = hStack_78.m_ptr;
            pfVar19 = local_80;
            uVar4 = local_90._8_8_;
            uVar3 = local_90._0_8_;
            uVar18 = uVar18 + 1;
          } while ((*rVar31._M_p & rVar31._M_mask) == 0);
          local_168 = local_70;
          auStack_178._0_8_ = local_80;
          auStack_178._8_8_ = hStack_78.m_ptr;
          arg.m_ptr = (PyObject *)local_90._0_8_;
          hStack_180.m_ptr = (PyObject *)local_90._8_8_;
          local_70 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_80 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_78.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_90._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_90._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar19;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar11.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar4;
          std::
          vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ::emplace_back<pybind11::detail::function_call>(&second_pass,(function_call *)&msg);
          bVar30 = false;
        }
LAB_0011deab:
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&second_pass_convert.super__Bvector_base<std::allocator<bool>_>);
        object::~object(&extra_args.super_object);
      }
      else {
LAB_0011db65:
        arg.m_ptr = hVar11.m_ptr;
        bVar30 = false;
      }
      object::~object(&kwargs.super_object);
LAB_0011ded1:
      detail::function_call::~function_call((function_call *)&msg);
      if (bVar30) break;
    }
  }
  pfVar19 = second_pass.
            super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  hVar11.m_ptr = local_120;
  if (((bVar29) &&
      (second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (local_120 == (PyObject *)0x1)) {
    local_120 = (PyObject *)0x1;
    pfVar12 = second_pass.
              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while ((hVar11.m_ptr = local_120, pfVar12 != pfVar19 &&
           (hVar11 = (*pfVar12->func->impl)(pfVar12), hVar11.m_ptr == (PyObject *)0x1))) {
      pfVar12 = pfVar12 + 1;
    }
  }
  local_120 = hVar11.m_ptr;
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&second_pass);
  if (local_120 == (PyObject *)0x0) {
    std::__cxx11::string::string
              ((string *)&msg,
               "Unable to convert function return value to a Python type! The signature was\n\t",
               (allocator *)&arg);
    std::__cxx11::string::append((char *)&msg);
    PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
  }
  else {
    if (local_120 != (PyObject *)0x1) {
      if ((pfVar9->field_0x59 & 1) == 0) {
        return local_120;
      }
      ptVar14 = detail::get_type_info((PyTypeObject *)(pfVar9->scope).m_ptr);
      (*ptVar14->init_holder)((instance *)local_b8.m_ptr,(void *)0x0);
      return local_120;
    }
    if ((pfVar9->field_0x59 & 4) != 0) {
      __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
      return (PyObject *)&_Py_NotImplementedStruct;
    }
    std::__cxx11::string::string((string *)&second_pass,pfVar9->name,(allocator *)&extra_args);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&second_pass
                   ,"(): incompatible ");
    pcVar22 = "function";
    if ((pfVar9->field_0x59 & 1) != 0) {
      pcVar22 = "constructor";
    }
    std::__cxx11::string::string((string *)&kwargs,pcVar22,(allocator *)&local_60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kwargs);
    std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   " arguments. The following argument types are supported:\n");
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&kwargs);
    std::__cxx11::string::~string((string *)&second_pass_convert);
    std::__cxx11::string::~string((string *)&second_pass);
    local_1a0 = 1;
    for (pfVar17 = pfVar9; pfVar17 != (function_record *)0x0; pfVar17 = pfVar17->next) {
      std::__cxx11::to_string((string *)&second_pass,local_1a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,"    ",(string *)&second_pass);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,". ");
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&second_pass_convert);
      std::__cxx11::string::~string((string *)&second_pass);
      if ((pfVar9->field_0x59 & 1) == 0) {
LAB_0011e21c:
        std::__cxx11::string::append((char *)&msg);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&arg,pfVar17->signature,(allocator *)&second_pass_convert);
        cVar23 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg;
        lVar21 = std::__cxx11::string::find(cVar23,0x28);
        pfVar19 = (pointer)(lVar21 + 7);
        if (hStack_180.m_ptr <= pfVar19) {
LAB_0011e211:
          std::__cxx11::string::~string((string *)&arg);
          goto LAB_0011e21c;
        }
        pfVar12 = (pointer)std::__cxx11::string::find((char *)&arg,0x124df8);
        std::__cxx11::string::rfind((char *)&arg,0x124dfb);
        if (pfVar12 < hStack_180.m_ptr) {
          pfVar13 = (pointer)((long)&pfVar12->func + 2);
        }
        else {
          pfVar13 = (pointer)std::__cxx11::string::find(cVar23,0x29);
          pfVar12 = pfVar13;
        }
        if ((pfVar12 <= pfVar19) || (hStack_180.m_ptr <= pfVar13)) goto LAB_0011e211;
        std::__cxx11::string::append((string *)&msg,(ulong)&arg,(ulong)pfVar19);
        std::__cxx11::string::push_back((char)&msg);
        std::__cxx11::string::append((string *)&msg,(ulong)&arg,(ulong)pfVar13);
        std::__cxx11::string::~string((string *)&arg);
      }
      std::__cxx11::string::append((char *)&msg);
      local_1a0 = local_1a0 + 1;
    }
    std::__cxx11::string::append((char *)&msg);
    args_in->ob_refcnt = args_in->ob_refcnt + 1;
    bVar29 = false;
    kwargs.super_object.super_handle.m_ptr = (object)(object)args_in;
    for (p_Var20 = (_Bit_type *)(ulong)((byte)pfVar9->field_0x59 & 1);
        p_Var15 = (_Bit_type *)PyTuple_Size(kwargs.super_object.super_handle.m_ptr),
        p_Var20 < p_Var15; p_Var20 = (_Bit_type *)((long)p_Var20 + 1)) {
      bVar30 = true;
      if (bVar29) {
        std::__cxx11::string::append((char *)&msg);
        bVar30 = bVar29;
      }
      bVar29 = bVar30;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           kwargs.super_object.super_handle.m_ptr;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var20;
      detail::accessor::operator_cast_to_object((accessor *)&extra_args);
      repr((pybind11 *)&second_pass,(handle)extra_args.super_object.super_handle.m_ptr);
      str::operator_cast_to_string((string *)&arg,(str *)&second_pass);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&arg);
      object::~object((object *)&second_pass);
      object::~object((object *)&extra_args);
      object::~object((object *)
                      &second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    }
    if (kwargs_in != (PyObject *)0x0) {
      kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      extra_args.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      lVar21 = PyDict_Size();
      if (lVar21 != 0) {
        if (bVar29) {
          std::__cxx11::string::append((char *)&msg);
        }
        std::__cxx11::string::append((char *)&msg);
        dict::begin((dict_iterator *)&arg,(dict *)&extra_args);
        bVar29 = true;
        while ((PyObject *)auStack_178._8_8_ != (PyObject *)0xffffffffffffffff) {
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)hStack_180.m_ptr;
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_178._0_8_;
          if (!bVar29) {
            std::__cxx11::string::append((char *)&msg);
          }
          str::str((str *)local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_60,local_40,(handle *)&second_pass);
          str::operator_cast_to_string((string *)&second_pass_convert,(str *)&local_60);
          std::__cxx11::string::append((string *)&msg);
          std::__cxx11::string::~string((string *)&second_pass_convert);
          object::~object(&local_60);
          object::~object((object *)local_40);
          bVar29 = false;
          detail::iterator_policies::dict_readonly::increment((dict_readonly *)&arg);
        }
      }
      object::~object(&extra_args.super_object);
    }
    PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
    object::~object(&kwargs.super_object);
  }
  std::__cxx11::string::~string((string *)&msg);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
                tinfo->init_holder(reinterpret_cast<instance *>(parent.ptr()), nullptr);
            }
            return result.ptr();
        }
    }